

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentfragment.cpp
# Opt level: O0

void __thiscall
QTextDocumentFragmentPrivate::insert(QTextDocumentFragmentPrivate *this,QTextCursor *_cursor)

{
  bool bVar1;
  QTextCursorPrivate *pQVar2;
  EVP_PKEY_CTX *src;
  QTextCopyHelper *in_RSI;
  EVP_PKEY_CTX *dst;
  QTextCursor *in_RDI;
  long in_FS_OFFSET;
  undefined1 uVar3;
  QTextDocumentPrivate *destPieceTable;
  QTextCursor sourceCursor;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  QTextDocument *in_stack_ffffffffffffff68;
  QTextDocumentPrivate *this_00;
  QTextCopyHelper *this_01;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  MoveMode in_stack_ffffffffffffff98;
  MoveOperation in_stack_ffffffffffffff9c;
  QTextCursor in_stack_ffffffffffffffa0;
  undefined1 *local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QTextCursor::isNull((QTextCursor *)
                              CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  if (!bVar1) {
    pQVar2 = QSharedDataPointer<QTextCursorPrivate>::operator->
                       ((QSharedDataPointer<QTextCursorPrivate> *)
                        CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    this_00 = pQVar2->priv;
    QTextDocumentPrivate::beginEditBlock(this_00);
    local_20[0] = &DAT_aaaaaaaaaaaaaaaa;
    QTextCursor::QTextCursor(in_RDI,in_stack_ffffffffffffff68);
    QTextCursor::movePosition
              ((QTextCursor *)in_stack_ffffffffffffffa0.d.d.ptr,in_stack_ffffffffffffff9c,
               in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
    uVar3 = ((ulong)in_RDI[2].d.d.ptr & 1) != 0;
    this_01 = in_RSI;
    QTextCursor::charFormat
              ((QTextCursor *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    dst = (EVP_PKEY_CTX *)local_20;
    QTextCopyHelper::QTextCopyHelper
              (this_01,(QTextCursor *)this_00,in_RDI,SUB81((ulong)in_RSI >> 0x38,0),
               (QTextCharFormat *)CONCAT17(uVar3,in_stack_ffffffffffffff60));
    QTextCopyHelper::copy((QTextCopyHelper *)&stack0xffffffffffffff90,dst,src);
    QTextCopyHelper::~QTextCopyHelper((QTextCopyHelper *)CONCAT17(uVar3,in_stack_ffffffffffffff60));
    QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x7e8ddd);
    QTextDocumentPrivate::endEditBlock
              ((QTextDocumentPrivate *)CONCAT17(uVar3,in_stack_ffffffffffffff60));
    QTextCursor::~QTextCursor((QTextCursor *)0x7e8df4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentFragmentPrivate::insert(QTextCursor &_cursor) const
{
    if (_cursor.isNull())
        return;

    QTextDocumentPrivate *destPieceTable = _cursor.d->priv;
    destPieceTable->beginEditBlock();

    QTextCursor sourceCursor(doc);
    sourceCursor.movePosition(QTextCursor::End, QTextCursor::KeepAnchor);
    QTextCopyHelper(sourceCursor, _cursor, importedFromPlainText, _cursor.charFormat()).copy();

    destPieceTable->endEditBlock();
}